

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

void aarch64_sync_64_to_32_aarch64(CPUARMState_conflict *env)

{
  uint64_t uVar1;
  uint uVar2;
  int iVar3;
  int local_14;
  uint32_t mode;
  int i;
  CPUARMState_conflict *env_local;
  
  uVar2 = env->uncached_cpsr & 0x1f;
  for (local_14 = 0; local_14 < 8; local_14 = local_14 + 1) {
    env->regs[local_14] = (uint32_t)env->xregs[local_14];
  }
  if (uVar2 == 0x11) {
    for (local_14 = 8; local_14 < 0xd; local_14 = local_14 + 1) {
      env->usr_regs[local_14 + -8] = (uint32_t)env->xregs[local_14];
    }
  }
  else {
    for (local_14 = 8; local_14 < 0xd; local_14 = local_14 + 1) {
      env->regs[local_14] = (uint32_t)env->xregs[local_14];
    }
  }
  if ((uVar2 == 0x10) || (uVar2 == 0x1f)) {
    env->regs[0xd] = (uint32_t)env->xregs[0xd];
    env->regs[0xe] = (uint32_t)env->xregs[0xe];
  }
  else {
    uVar1 = env->xregs[0xd];
    iVar3 = bank_number(0x10);
    env->banked_r13[iVar3] = (uint32_t)uVar1;
    if (uVar2 == 0x1a) {
      env->regs[0xe] = (uint32_t)env->xregs[0xe];
    }
    else {
      uVar1 = env->xregs[0xe];
      iVar3 = r14_bank_number(0x10);
      env->banked_r14[iVar3] = (uint32_t)uVar1;
    }
  }
  if (uVar2 == 0x1a) {
    env->regs[0xd] = (uint32_t)env->xregs[0xf];
  }
  else {
    uVar1 = env->xregs[0xf];
    iVar3 = bank_number(0x1a);
    env->banked_r13[iVar3] = (uint32_t)uVar1;
  }
  if (uVar2 == 0x12) {
    env->regs[0xe] = (uint32_t)env->xregs[0x10];
    env->regs[0xd] = (uint32_t)env->xregs[0x11];
  }
  else {
    uVar1 = env->xregs[0x10];
    iVar3 = r14_bank_number(0x12);
    env->banked_r14[iVar3] = (uint32_t)uVar1;
    uVar1 = env->xregs[0x11];
    iVar3 = bank_number(0x12);
    env->banked_r13[iVar3] = (uint32_t)uVar1;
  }
  if (uVar2 == 0x13) {
    env->regs[0xe] = (uint32_t)env->xregs[0x12];
    env->regs[0xd] = (uint32_t)env->xregs[0x13];
  }
  else {
    uVar1 = env->xregs[0x12];
    iVar3 = r14_bank_number(0x13);
    env->banked_r14[iVar3] = (uint32_t)uVar1;
    uVar1 = env->xregs[0x13];
    iVar3 = bank_number(0x13);
    env->banked_r13[iVar3] = (uint32_t)uVar1;
  }
  if (uVar2 == 0x17) {
    env->regs[0xe] = (uint32_t)env->xregs[0x14];
    env->regs[0xd] = (uint32_t)env->xregs[0x15];
  }
  else {
    uVar1 = env->xregs[0x14];
    iVar3 = r14_bank_number(0x17);
    env->banked_r14[iVar3] = (uint32_t)uVar1;
    uVar1 = env->xregs[0x15];
    iVar3 = bank_number(0x17);
    env->banked_r13[iVar3] = (uint32_t)uVar1;
  }
  if (uVar2 == 0x1b) {
    env->regs[0xe] = (uint32_t)env->xregs[0x16];
    env->regs[0xd] = (uint32_t)env->xregs[0x17];
  }
  else {
    uVar1 = env->xregs[0x16];
    iVar3 = r14_bank_number(0x1b);
    env->banked_r14[iVar3] = (uint32_t)uVar1;
    uVar1 = env->xregs[0x17];
    iVar3 = bank_number(0x1b);
    env->banked_r13[iVar3] = (uint32_t)uVar1;
  }
  if (uVar2 == 0x11) {
    for (local_14 = 0x18; local_14 < 0x1f; local_14 = local_14 + 1) {
      env->regs[local_14 + -0x10] = (uint32_t)env->xregs[local_14];
    }
  }
  else {
    for (local_14 = 0x18; local_14 < 0x1d; local_14 = local_14 + 1) {
      env->fiq_regs[local_14 + -0x18] = (uint32_t)env->xregs[local_14];
    }
    uVar1 = env->xregs[0x1d];
    iVar3 = bank_number(0x11);
    env->banked_r13[iVar3] = (uint32_t)uVar1;
    uVar1 = env->xregs[0x1e];
    iVar3 = r14_bank_number(0x11);
    env->banked_r14[iVar3] = (uint32_t)uVar1;
  }
  env->regs[0xf] = (uint32_t)env->pc;
  return;
}

Assistant:

void aarch64_sync_64_to_32(CPUARMState *env)
{
    int i;
    uint32_t mode = env->uncached_cpsr & CPSR_M;

    /* We can blanket copy X[0:7] to R[0:7] */
    for (i = 0; i < 8; i++) {
        env->regs[i] = env->xregs[i];
    }

    /*
     * Unless we are in FIQ mode, r8-r12 come from the user registers x8-x12.
     * Otherwise, we copy x8-x12 into the banked user regs.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 8; i < 13; i++) {
            env->usr_regs[i - 8] = env->xregs[i];
        }
    } else {
        for (i = 8; i < 13; i++) {
            env->regs[i] = env->xregs[i];
        }
    }

    /*
     * Registers r13 & r14 depend on the current mode.
     * If we are in a given mode, we copy the corresponding x registers to r13
     * and r14.  Otherwise, we copy the x register to the banked r13 and r14
     * for the mode.
     */
    if (mode == ARM_CPU_MODE_USR || mode == ARM_CPU_MODE_SYS) {
        env->regs[13] = env->xregs[13];
        env->regs[14] = env->xregs[14];
    } else {
        env->banked_r13[bank_number(ARM_CPU_MODE_USR)] = env->xregs[13];

        /*
         * HYP is an exception in that it does not have its own banked r14 but
         * shares the USR r14
         */
        if (mode == ARM_CPU_MODE_HYP) {
            env->regs[14] = env->xregs[14];
        } else {
            env->banked_r14[r14_bank_number(ARM_CPU_MODE_USR)] = env->xregs[14];
        }
    }

    if (mode == ARM_CPU_MODE_HYP) {
        env->regs[13] = env->xregs[15];
    } else {
        env->banked_r13[bank_number(ARM_CPU_MODE_HYP)] = env->xregs[15];
    }

    if (mode == ARM_CPU_MODE_IRQ) {
        env->regs[14] = env->xregs[16];
        env->regs[13] = env->xregs[17];
    } else {
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_IRQ)] = env->xregs[16];
        env->banked_r13[bank_number(ARM_CPU_MODE_IRQ)] = env->xregs[17];
    }

    if (mode == ARM_CPU_MODE_SVC) {
        env->regs[14] = env->xregs[18];
        env->regs[13] = env->xregs[19];
    } else {
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_SVC)] = env->xregs[18];
        env->banked_r13[bank_number(ARM_CPU_MODE_SVC)] = env->xregs[19];
    }

    if (mode == ARM_CPU_MODE_ABT) {
        env->regs[14] = env->xregs[20];
        env->regs[13] = env->xregs[21];
    } else {
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_ABT)] = env->xregs[20];
        env->banked_r13[bank_number(ARM_CPU_MODE_ABT)] = env->xregs[21];
    }

    if (mode == ARM_CPU_MODE_UND) {
        env->regs[14] = env->xregs[22];
        env->regs[13] = env->xregs[23];
    } else {
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_UND)] = env->xregs[22];
        env->banked_r13[bank_number(ARM_CPU_MODE_UND)] = env->xregs[23];
    }

    /* Registers x24-x30 are mapped to r8-r14 in FIQ mode.  If we are in FIQ
     * mode, then we can copy to r8-r14.  Otherwise, we copy to the
     * FIQ bank for r8-r14.
     */
    if (mode == ARM_CPU_MODE_FIQ) {
        for (i = 24; i < 31; i++) {
            env->regs[i - 16] = env->xregs[i];   /* X[24:30] -> R[8:14] */
        }
    } else {
        for (i = 24; i < 29; i++) {
            env->fiq_regs[i - 24] = env->xregs[i];
        }
        env->banked_r13[bank_number(ARM_CPU_MODE_FIQ)] = env->xregs[29];
        env->banked_r14[r14_bank_number(ARM_CPU_MODE_FIQ)] = env->xregs[30];
    }

    env->regs[15] = env->pc;
}